

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::HandleMaterialReferences_3DGS_MDL7(MDLImporter *this)

{
  aiMaterial *this_00;
  aiReturn aVar1;
  aiScene *paVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iIndex;
  uint local_2c;
  
  paVar2 = this->pScene;
  if (paVar2->mNumMaterials != 0) {
    uVar6 = 0;
    do {
      local_2c = 0;
      aVar1 = aiGetMaterialIntegerArray
                        (paVar2->mMaterials[uVar6],"&&&referrer&&&",0,0,(int *)&local_2c,(uint *)0x0
                        );
      if (aVar1 == aiReturn_SUCCESS) {
        paVar2 = this->pScene;
        if (paVar2->mNumMeshes != 0) {
          uVar4 = 0;
          do {
            if (uVar6 == paVar2->mMeshes[uVar4]->mMaterialIndex) {
              paVar2->mMeshes[uVar4]->mMaterialIndex = local_2c;
              paVar2 = this->pScene;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < paVar2->mNumMeshes);
        }
        this_00 = paVar2->mMaterials[uVar6];
        if (this_00 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(this_00);
        }
        operator_delete(this_00,0x10);
        paVar2 = this->pScene;
        uVar3 = paVar2->mNumMaterials - 1;
        uVar4 = uVar6;
        if (uVar6 < uVar3) {
          do {
            paVar2->mMaterials[uVar4] = paVar2->mMaterials[uVar4 + 1];
            paVar2 = this->pScene;
            if (paVar2->mNumMeshes != 0) {
              uVar5 = 0;
              do {
                uVar3 = paVar2->mMeshes[uVar5]->mMaterialIndex;
                if (uVar6 < uVar3) {
                  paVar2->mMeshes[uVar5]->mMaterialIndex = uVar3 - 1;
                  paVar2 = this->pScene;
                }
                uVar5 = uVar5 + 1;
              } while (uVar5 < paVar2->mNumMeshes);
            }
            uVar4 = uVar4 + 1;
            uVar3 = paVar2->mNumMaterials - 1;
          } while (uVar4 < uVar3);
        }
        paVar2->mNumMaterials = uVar3;
      }
      uVar6 = uVar6 + 1;
      paVar2 = this->pScene;
    } while (uVar6 < paVar2->mNumMaterials);
  }
  return;
}

Assistant:

void MDLImporter::HandleMaterialReferences_3DGS_MDL7()
{
    // search for referrer materials
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
        int iIndex = 0;
        if (AI_SUCCESS == aiGetMaterialInteger(pScene->mMaterials[i],AI_MDL7_REFERRER_MATERIAL, &iIndex) )  {
            for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                aiMesh* const pcMesh = pScene->mMeshes[a];
                if (i == pcMesh->mMaterialIndex) {
                    pcMesh->mMaterialIndex = iIndex;
                }
            }
            // collapse the rest of the array
            delete pScene->mMaterials[i];
            for (unsigned int pp = i; pp < pScene->mNumMaterials-1;++pp)    {

                pScene->mMaterials[pp] = pScene->mMaterials[pp+1];
                for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                    aiMesh* const pcMesh = pScene->mMeshes[a];
                    if (pcMesh->mMaterialIndex > i)--pcMesh->mMaterialIndex;
                }
            }
            --pScene->mNumMaterials;
        }
    }
}